

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall QtPromise::resolve<int&>(QtPromise *this,int *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  int *local_18;
  int *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (int *)this;
  QPromise<int>::
  QPromise<QtPromise::resolve<int&>(int&)::_lambda(QtPromise::QPromiseResolve<int>&&,QtPromise::QPromiseReject<int>&&)_1_>
            ((QPromise<int> *)this,&local_20);
  TVar1.super_QPromiseBase<int>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<int>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}